

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HTS_label.c
# Opt level: O0

double HTS_Label_get_start_frame(HTS_Label *label,size_t index)

{
  HTS_LabelString *lstring;
  size_t i;
  size_t index_local;
  HTS_Label *label_local;
  double local_8;
  
  lstring = label->head;
  for (i = 0; i < index && lstring != (HTS_LabelString *)0x0; i = i + 1) {
    lstring = lstring->next;
  }
  if (lstring == (HTS_LabelString *)0x0) {
    local_8 = -1.0;
  }
  else {
    local_8 = lstring->start;
  }
  return local_8;
}

Assistant:

double HTS_Label_get_start_frame(HTS_Label * label, size_t index)
{
   size_t i;
   HTS_LabelString *lstring = label->head;

   for (i = 0; i < index && lstring; i++)
      lstring = lstring->next;
   if (!lstring)
      return -1.0;
   return lstring->start;
}